

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

bool re2::Regexp::Equal(Regexp *a,Regexp *b)

{
  bool bVar1;
  ulong uVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  Regexp *b2;
  Regexp *a2;
  vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> stk;
  Regexp *local_58;
  Regexp *local_50;
  vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> local_48;
  
  if (a == (Regexp *)0x0 || b == (Regexp *)0x0) {
    bVar7 = a == b;
  }
  else {
    bVar7 = TopEqual(a,b);
    if (bVar7) {
      bVar7 = true;
      if (a->op_ - 5 < 7) {
        local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (Regexp **)0x0;
        local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (Regexp **)0x0;
        do {
          if (a->op_ - 7 < 5) {
            if (a->nsub_ < 2) {
              paVar3 = &a->field_5;
            }
            else {
              paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(a->field_5).submany_;
            }
            local_50 = paVar3->subone_;
            if (b->nsub_ < 2) {
              paVar3 = &b->field_5;
            }
            else {
              paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(b->field_5).submany_;
            }
            local_58 = paVar3->subone_;
            bVar7 = TopEqual(local_50,local_58);
            iVar5 = 1;
            if (bVar7) {
              iVar5 = 4;
              a = local_50;
              b = local_58;
            }
          }
          else {
            if (a->op_ - 5 < 2) {
              uVar2 = (ulong)a->nsub_;
              iVar5 = 6;
              bVar7 = a->nsub_ != 0;
              if (bVar7) {
                uVar6 = 0;
                do {
                  paVar3 = &a->field_5;
                  if (1 < (ushort)uVar2) {
                    paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(a->field_5).submany_;
                  }
                  local_50 = paVar3[uVar6].subone_;
                  paVar3 = &b->field_5;
                  if (1 < b->nsub_) {
                    paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(b->field_5).submany_;
                  }
                  local_58 = paVar3[uVar6].subone_;
                  bVar1 = TopEqual(local_50,local_58);
                  if (!bVar1) {
                    iVar5 = 1;
                    goto LAB_001bf727;
                  }
                  if (local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<re2::Regexp*,std::allocator<re2::Regexp*>>::
                    _M_realloc_insert<re2::Regexp*const&>
                              ((vector<re2::Regexp*,std::allocator<re2::Regexp*>> *)&local_48,
                               (iterator)
                               local_48.
                               super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish,&local_50);
                  }
                  else {
                    *local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish = local_50;
                    local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  if (local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<re2::Regexp*,std::allocator<re2::Regexp*>>::
                    _M_realloc_insert<re2::Regexp*const&>
                              ((vector<re2::Regexp*,std::allocator<re2::Regexp*>> *)&local_48,
                               (iterator)
                               local_48.
                               super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish,&local_58);
                  }
                  else {
                    *local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish = local_58;
                    local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  uVar6 = uVar6 + 1;
                  uVar2 = (ulong)a->nsub_;
                  bVar7 = uVar6 < uVar2;
                } while (bVar7);
                iVar5 = 6;
              }
LAB_001bf727:
              if (bVar7) goto LAB_001bf765;
            }
            if ((long)local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                      _M_impl.super__Vector_impl_data._M_start == 0) {
              iVar5 = 3;
            }
            else {
              lVar4 = (long)local_48.
                            super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_48.
                            super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3;
              a = local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar4 + -2];
              b = local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl
                  .super__Vector_impl_data._M_finish[-1];
              iVar5 = 0;
              std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::resize
                        (&local_48,lVar4 - 2);
            }
          }
LAB_001bf765:
        } while ((iVar5 == 0) || (iVar5 == 4));
        bVar7 = iVar5 == 3;
        if (local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
    else {
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool Regexp::Equal(Regexp* a, Regexp* b) {
  if (a == NULL || b == NULL)
    return a == b;

  if (!TopEqual(a, b))
    return false;

  // Fast path:
  // return without allocating vector if there are no subregexps.
  switch (a->op()) {
    case kRegexpAlternate:
    case kRegexpConcat:
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
    case kRegexpRepeat:
    case kRegexpCapture:
      break;

    default:
      return true;
  }

  // Committed to doing real work.
  // The stack (vector) has pairs of regexps waiting to
  // be compared.  The regexps are only equal if
  // all the pairs end up being equal.
  std::vector<Regexp*> stk;

  for (;;) {
    // Invariant: TopEqual(a, b) == true.
    Regexp* a2;
    Regexp* b2;
    switch (a->op()) {
      default:
        break;
      case kRegexpAlternate:
      case kRegexpConcat:
        for (int i = 0; i < a->nsub(); i++) {
          a2 = a->sub()[i];
          b2 = b->sub()[i];
          if (!TopEqual(a2, b2))
            return false;
          stk.push_back(a2);
          stk.push_back(b2);
        }
        break;

      case kRegexpStar:
      case kRegexpPlus:
      case kRegexpQuest:
      case kRegexpRepeat:
      case kRegexpCapture:
        a2 = a->sub()[0];
        b2 = b->sub()[0];
        if (!TopEqual(a2, b2))
          return false;
        // Really:
        //   stk.push_back(a2);
        //   stk.push_back(b2);
        //   break;
        // but faster to assign directly and loop.
        a = a2;
        b = b2;
        continue;
    }

    size_t n = stk.size();
    if (n == 0)
      break;

    DCHECK_GE(n, 2);
    a = stk[n-2];
    b = stk[n-1];
    stk.resize(n-2);
  }

  return true;
}